

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TThreadsFactory.cpp
# Opt level: O1

void __thiscall TThreadsFactory::WaitForAllThreads(TThreadsFactory *this)

{
  uint uVar1;
  
  if (this->fMaxThreads != 0) {
    uVar1 = 0;
    do {
      sem_wait((sem_t *)&this->fCreationLimiter);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->fMaxThreads);
  }
  if (this->fMaxThreads != 0) {
    uVar1 = 0;
    do {
      sem_post((sem_t *)&this->fCreationLimiter);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->fMaxThreads);
  }
  return;
}

Assistant:

void TThreadsFactory::WaitForAllThreads(void)
{
    /* Wait for all the threads to complete
     * Beware, this will lock any new thread creation
     */
    for (unsigned int i = 0; i < fMaxThreads; ++i)
        sem_wait(&fCreationLimiter);

    /* Unlock everything now */
    for (unsigned int i = 0; i < fMaxThreads; ++i)
        sem_post(&fCreationLimiter);
}